

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O1

void get_progress(void *coder_ptr,uint64_t *progress_in,uint64_t *progress_out)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  bVar2 = true;
  do {
    if (bVar2) {
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)((long)coder_ptr + 0x168));
      if (iVar3 != 0) {
LAB_001a1d1e:
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                      ,0xc4,"void mythread_mutex_lock(mythread_mutex *)");
      }
    }
    else {
      iVar3 = pthread_mutex_unlock((pthread_mutex_t *)((long)coder_ptr + 0x168));
      if (iVar3 != 0) {
LAB_001a1d3d:
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                      ,0xcc,"void mythread_mutex_unlock(mythread_mutex *)");
      }
    }
    if (!bVar2) {
      return;
    }
    *progress_in = *(uint64_t *)((long)coder_ptr + 0x158);
    *progress_out = *(uint64_t *)((long)coder_ptr + 0x160);
    bVar2 = false;
    if (*(int *)((long)coder_ptr + 0x144) != 0) {
      uVar5 = 0;
      do {
        bVar2 = true;
        lVar4 = uVar5 * 0x1c0;
        while( true ) {
          if (bVar2) {
            iVar3 = pthread_mutex_lock((pthread_mutex_t *)
                                       (*(long *)((long)coder_ptr + 0x138) + lVar4 + 0x160));
            if (iVar3 != 0) goto LAB_001a1d1e;
          }
          else {
            iVar3 = pthread_mutex_unlock
                              ((pthread_mutex_t *)
                               (*(long *)((long)coder_ptr + 0x138) + lVar4 + 0x160));
            if (iVar3 != 0) goto LAB_001a1d3d;
          }
          if (!bVar2) break;
          lVar1 = *(long *)((long)coder_ptr + 0x138);
          *progress_in = *progress_in + *(long *)(lVar1 + 0x30 + lVar4);
          *progress_out = *progress_out + *(long *)(lVar1 + 0x38 + lVar4);
          bVar2 = false;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < *(uint *)((long)coder_ptr + 0x144));
      bVar2 = false;
    }
  } while( true );
}

Assistant:

static void
get_progress(void *coder_ptr, uint64_t *progress_in, uint64_t *progress_out)
{
	lzma_stream_coder *coder = coder_ptr;

	// Lock coder->mutex to prevent finishing threads from moving their
	// progress info from the worker_thread structure to lzma_stream_coder.
	mythread_sync(coder->mutex) {
		*progress_in = coder->progress_in;
		*progress_out = coder->progress_out;

		for (size_t i = 0; i < coder->threads_initialized; ++i) {
			mythread_sync(coder->threads[i].mutex) {
				*progress_in += coder->threads[i].progress_in;
				*progress_out += coder->threads[i]
						.progress_out;
			}
		}
	}